

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O3

int kj::_::Debug::getOsErrorNumber(bool nonblocking)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  undefined3 in_register_00000039;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  iVar4 = 0;
  if (CONCAT31(in_register_00000039,nonblocking) == 0) {
    iVar4 = iVar1;
  }
  if (iVar1 != 0xb) {
    iVar4 = iVar1;
  }
  iVar2 = -1;
  if (iVar1 != 4) {
    iVar2 = iVar4;
  }
  return iVar2;
}

Assistant:

int Debug::getOsErrorNumber(bool nonblocking) {
  int result = errno;

  // On many systems, EAGAIN and EWOULDBLOCK have the same value, but this is not strictly required
  // by POSIX, so we need to check both.
  return result == EINTR ? -1
       : nonblocking && (result == EAGAIN || result == EWOULDBLOCK) ? 0
       : result;
}